

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

void __thiscall
TTD::ThreadContextTTD::ClearContextsForSnapRestore
          (ThreadContextTTD *this,
          List<FinalizableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *deadCtxs)

{
  int iVar1;
  Type *ppSVar2;
  FinalizableObject *pFVar3;
  int index;
  Type local_40;
  ScriptContext *ctx;
  
  if (0 < (this->m_contextList).
          super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.count) {
    ctx = (ScriptContext *)&this->m_contextList;
    index = 0;
    do {
      ppSVar2 = JsUtil::
                List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)ctx,index);
      local_40 = *ppSVar2;
      pFVar3 = JsUtil::
               BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item(&this->m_ttdContextToExternalRefMap,&local_40);
      JsUtil::
      List<FinalizableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(deadCtxs,0);
      iVar1 = (deadCtxs->
              super_ReadOnlyList<FinalizableObject_*,_Memory::HeapAllocator,_DefaultComparer>).count
      ;
      (deadCtxs->super_ReadOnlyList<FinalizableObject_*,_Memory::HeapAllocator,_DefaultComparer>).
      buffer[iVar1] = pFVar3;
      (deadCtxs->super_ReadOnlyList<FinalizableObject_*,_Memory::HeapAllocator,_DefaultComparer>).
      count = iVar1 + 1;
      index = index + 1;
    } while (index < (this->m_contextList).
                     super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                     .count);
  }
  JsUtil::
  BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->m_ttdContextToExternalRefMap);
  (this->m_contextList).
  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.count = 0;
  this->m_activeContext = (ScriptContext *)0x0;
  return;
}

Assistant:

void ThreadContextTTD::ClearContextsForSnapRestore(JsUtil::List<FinalizableObject*, HeapAllocator>& deadCtxs)
    {
        for(int32 i = 0; i < this->m_contextList.Count(); ++i)
        {
            Js::ScriptContext* ctx = this->m_contextList.Item(i);
            FinalizableObject* externalCtx = this->m_ttdContextToExternalRefMap.Item(ctx);

            deadCtxs.Add(externalCtx);
        }
        this->m_ttdContextToExternalRefMap.Clear();
        this->m_contextList.Clear();

        this->m_activeContext = nullptr;
    }